

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O3

vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> * __thiscall
Epoll::getEventRequest
          (vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
           *__return_storage_ptr__,Epoll *this,int events_num)

{
  int iVar1;
  long lVar2;
  SP_Channel cur_req;
  value_type local_1018;
  Logger local_1008;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < events_num) {
    lVar2 = 0;
    do {
      iVar1 = *(int *)((long)&((this->events_).
                               super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl
                               .super__Vector_impl_data._M_start)->data + lVar2);
      local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           this->fd2chan_[iVar1].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this->fd2chan_[iVar1].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        Logger::Logger(&local_1008,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/Epoll.cpp"
                       ,0x6e);
        if (8 < ((int)&local_1008 + 0xfa8) - (int)local_1008.impl_.stream_.buffer_.cur_) {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"SP cur_r",8);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 8;
        }
        Logger::~Logger(&local_1008);
      }
      else {
        (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->revents_ =
             *(__uint32_t *)
              ((long)&((this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                       ._M_impl.super__Vector_impl_data._M_start)->events + lVar2);
        (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ = 0;
        std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
                  (__return_storage_ptr__,&local_1018);
      }
      if (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1018.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      lVar2 = lVar2 + 0xc;
    } while ((ulong)(uint)events_num * 0xc != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SP_Channel> Epoll::getEventRequest(int events_num){
    std::vector<SP_Channel> req_data;
    for (int i=0; i<events_num; ++i) {
        // 获取有事件产生的描述符
        int fd = events_[i].data.fd;

        SP_Channel cur_req = fd2chan_[fd];

        if (cur_req) {
            cur_req->setRevents(events_[i].events);
            cur_req->setEvents(0);
            // 加入线程池之前将timer和request分离
            // cur_req->seperateTimer();
            req_data.push_back(cur_req);
        }else {
            LOG<<"SP cur_req is invalid";
        }
    }
    return req_data;
}